

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O3

void kj::anon_unknown_0::testHttpServerRequest
               (WaitScope *waitScope,Timer *timer,HttpRequestTestCase *requestCase,
               HttpResponseTestCase *responseCase,TwoWayPipe *pipe)

{
  AsyncIoStream *pAVar1;
  Settings settings;
  PromiseNode *pPVar2;
  undefined8 uVar3;
  Promise<void> PVar4;
  StringPtr expected;
  Promise<void> listenTask;
  HttpHeaderTable table;
  TestHttpService service;
  HttpServer server;
  Own<kj::_::PromiseNode> local_368;
  undefined1 local_358 [24];
  AsyncIoStream *pAStack_340;
  undefined8 local_330;
  Duration DStack_328;
  Duration local_320;
  Duration DStack_318;
  HttpHeaderTable local_310;
  ExceptionOrValue local_2e0;
  char local_180;
  HttpService local_178;
  HttpRequestTestCase *local_170;
  HttpResponseTestCase *local_168;
  undefined8 local_160;
  undefined8 uStack_158;
  HttpHeaders local_150;
  int local_f0;
  HttpServer local_e8;
  
  HttpHeaderTable::HttpHeaderTable(&local_310);
  local_178._vptr_HttpService = (_func_int **)&PTR_request_0043de00;
  local_160 = 0;
  uStack_158 = 0;
  local_170 = requestCase;
  local_168 = responseCase;
  HttpHeaders::HttpHeaders(&local_150,&local_310);
  local_f0 = 0;
  local_330 = 15000000000;
  DStack_328.value = 5000000000;
  local_320.value = 1000000000;
  DStack_318.value = 0x10000;
  settings.pipelineTimeout.value = 5000000000;
  settings.headerTimeout.value = 15000000000;
  settings.canceledUploadGacePeriod.value = 1000000000;
  settings.canceledUploadGraceBytes = 0x10000;
  HttpServer::HttpServer(&local_e8,timer,&local_310,&local_178,settings);
  local_358._16_8_ = pipe->ends[0].disposer;
  pAStack_340 = pipe->ends[0].ptr;
  pipe->ends[0].ptr = (AsyncIoStream *)0x0;
  PVar4 = HttpServer::listenHttp((HttpServer *)local_358,(Own<kj::AsyncIoStream> *)&local_e8);
  pAVar1 = pAStack_340;
  if (pAStack_340 != (AsyncIoStream *)0x0) {
    pAStack_340 = (AsyncIoStream *)0x0;
    (*(code *)(((((Vector<kj::StringPtr> *)local_358._16_8_)->builder).ptr)->content).ptr)
              (local_358._16_8_,
               (pAVar1->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
               (long)&(pAVar1->super_AsyncInputStream)._vptr_AsyncInputStream,
               PVar4.super_PromiseBase.node.ptr);
  }
  pAVar1 = pipe->ends[1].ptr;
  (**(pAVar1->super_AsyncOutputStream)._vptr_AsyncOutputStream)
            (&local_368,&pAVar1->super_AsyncOutputStream,(requestCase->raw).content.ptr,
             (requestCase->raw).content.size_ - 1);
  local_2e0.exception.ptr.isSet = false;
  local_180 = '\0';
  _::waitImpl(&local_368,&local_2e0,waitScope);
  if (local_180 == '\x01') {
    if (local_2e0.exception.ptr.isSet != false) {
      throwRecoverableException(&local_2e0.exception.ptr.field_1.value,0);
    }
  }
  else {
    if (local_2e0.exception.ptr.isSet == false) {
      _::unreachable();
    }
    throwRecoverableException(&local_2e0.exception.ptr.field_1.value,0);
  }
  if (local_2e0.exception.ptr.isSet == true) {
    Exception::~Exception(&local_2e0.exception.ptr.field_1.value);
  }
  pPVar2 = local_368.ptr;
  if (local_368.ptr != (PromiseNode *)0x0) {
    local_368.ptr = (PromiseNode *)0x0;
    (**(local_368.disposer)->_vptr_Disposer)
              (local_368.disposer,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode);
  }
  (*((pipe->ends[1].ptr)->super_AsyncInputStream)._vptr_AsyncInputStream[4])();
  expected.content.size_ = (size_t)(responseCase->raw).content.ptr;
  expected.content.ptr = (char *)pipe->ends[1].ptr;
  expectRead((AsyncInputStream *)&local_368,expected);
  local_2e0.exception.ptr.isSet = false;
  local_180 = '\0';
  _::waitImpl(&local_368,&local_2e0,waitScope);
  if (local_180 == '\x01') {
    if (local_2e0.exception.ptr.isSet != false) {
      throwRecoverableException(&local_2e0.exception.ptr.field_1.value,0);
    }
  }
  else {
    if (local_2e0.exception.ptr.isSet == false) {
      _::unreachable();
    }
    throwRecoverableException(&local_2e0.exception.ptr.field_1.value,0);
  }
  if (local_2e0.exception.ptr.isSet == true) {
    Exception::~Exception(&local_2e0.exception.ptr.field_1.value);
  }
  pPVar2 = local_368.ptr;
  if (local_368.ptr != (PromiseNode *)0x0) {
    local_368.ptr = (PromiseNode *)0x0;
    (**(local_368.disposer)->_vptr_Disposer)
              (local_368.disposer,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode);
  }
  local_2e0.exception.ptr.isSet = false;
  local_180 = '\0';
  _::waitImpl((Own<kj::_::PromiseNode> *)local_358,&local_2e0,waitScope);
  if (local_180 == '\x01') {
    if (local_2e0.exception.ptr.isSet != false) {
      throwRecoverableException(&local_2e0.exception.ptr.field_1.value,0);
    }
  }
  else {
    if (local_2e0.exception.ptr.isSet == false) {
      _::unreachable();
    }
    throwRecoverableException(&local_2e0.exception.ptr.field_1.value,0);
  }
  if (local_2e0.exception.ptr.isSet == true) {
    Exception::~Exception(&local_2e0.exception.ptr.field_1.value);
  }
  if ((local_f0 != 1) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x287,ERROR,"\"failed: expected \" \"service.getRequestCount() == 1\"",
               (char (*) [48])"failed: expected service.getRequestCount() == 1");
  }
  uVar3 = local_358._8_8_;
  if ((PromiseNode *)local_358._8_8_ != (PromiseNode *)0x0) {
    local_358._8_8_ = (PromiseNode *)0x0;
    (**(code **)*(_func_int **)local_358._0_8_)
              (local_358._0_8_,(*(_func_int ***)uVar3)[-2] + (long)(_func_int ***)uVar3);
  }
  HttpServer::~HttpServer(&local_e8);
  HttpHeaders::~HttpHeaders(&local_150);
  HttpHeaderTable::~HttpHeaderTable(&local_310);
  return;
}

Assistant:

void testHttpServerRequest(kj::WaitScope& waitScope, kj::Timer& timer,
                           const HttpRequestTestCase& requestCase,
                           const HttpResponseTestCase& responseCase,
                           kj::TwoWayPipe pipe) {
  HttpHeaderTable table;
  TestHttpService service(requestCase, responseCase, table);
  HttpServer server(timer, table, service);

  auto listenTask = server.listenHttp(kj::mv(pipe.ends[0]));

  pipe.ends[1]->write(requestCase.raw.begin(), requestCase.raw.size()).wait(waitScope);
  pipe.ends[1]->shutdownWrite();

  expectRead(*pipe.ends[1], responseCase.raw).wait(waitScope);

  listenTask.wait(waitScope);

  KJ_EXPECT(service.getRequestCount() == 1);
}